

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_addtimeout(Curl_easy *data,timeval *stamp,expire_id eid)

{
  curl_llist *list;
  time_node *ne;
  size_t sVar1;
  time_t tVar2;
  time_t diff;
  time_node *check;
  curl_llist *timeoutlist;
  size_t n;
  curl_llist_element *prev;
  time_node *node;
  curl_llist_element *e;
  expire_id eid_local;
  timeval *stamp_local;
  Curl_easy *data_local;
  
  n = 0;
  list = &(data->state).timeoutlist;
  ne = (data->state).expires + eid;
  (ne->time).tv_sec = stamp->tv_sec;
  (ne->time).tv_usec = stamp->tv_usec;
  ne->eid = eid;
  sVar1 = Curl_llist_count(list);
  if (sVar1 != 0) {
    node = (time_node *)list->head;
    while ((node != (time_node *)0x0 &&
           (tVar2 = curlx_tvdiff(*(timeval *)((long)(node->list).ptr + 0x18),ne->time), tVar2 < 1)))
    {
      n = (size_t)node;
      node = (time_node *)(node->list).next;
    }
  }
  Curl_llist_insert_next(list,(curl_llist_element *)n,ne,&ne->list);
  return CURLM_OK;
}

Assistant:

static CURLMcode
multi_addtimeout(struct Curl_easy *data,
                 struct timeval *stamp,
                 expire_id eid)
{
  struct curl_llist_element *e;
  struct time_node *node;
  struct curl_llist_element *prev = NULL;
  size_t n;
  struct curl_llist *timeoutlist = &data->state.timeoutlist;

  node = &data->state.expires[eid];

  /* copy the timestamp and id */
  memcpy(&node->time, stamp, sizeof(*stamp));
  node->eid = eid; /* also marks it as in use */

  n = Curl_llist_count(timeoutlist);
  if(n) {
    /* find the correct spot in the list */
    for(e = timeoutlist->head; e; e = e->next) {
      struct time_node *check = (struct time_node *)e->ptr;
      time_t diff = curlx_tvdiff(check->time, node->time);
      if(diff > 0)
        break;
      prev = e;
    }

  }
  /* else
     this is the first timeout on the list */

  Curl_llist_insert_next(timeoutlist, prev, node, &node->list);
  return CURLM_OK;
}